

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmCTestBuildCommand.cxx
# Opt level: O1

cmCTestGenericHandler * __thiscall cmCTestBuildCommand::InitializeHandler(cmCTestBuildCommand *this)

{
  pointer pcVar1;
  cmMakefile *pcVar2;
  cmCTest *pcVar3;
  bool bVar4;
  int iVar5;
  cmCTestBuildHandler *pcVar6;
  char *pcVar7;
  char *pcVar8;
  char *pcVar9;
  string *psVar10;
  cmake *this_00;
  size_t sVar11;
  cmGlobalGenerator *pcVar12;
  ostream *poVar13;
  char *pcVar14;
  string dir;
  string e;
  string buildCommand;
  string local_298;
  char *local_278;
  string local_270;
  undefined1 local_250 [112];
  ios_base local_1e0 [264];
  char *local_d8;
  string local_d0;
  string local_b0;
  string local_90;
  string local_70;
  string local_50;
  
  pcVar6 = (cmCTestBuildHandler *)
           cmCTest::GetInitializedHandler
                     ((this->super_cmCTestHandlerCommand).super_cmCTestCommand.CTest,"build");
  pcVar1 = local_250 + 0x10;
  local_250._0_8_ = pcVar1;
  if (pcVar6 == (cmCTestBuildHandler *)0x0) {
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)local_250,"internal CTest error. Cannot instantiate build handler","");
    cmCommand::SetError((cmCommand *)this,(string *)local_250);
    if ((pointer)local_250._0_8_ != pcVar1) {
LAB_00316185:
      operator_delete((void *)local_250._0_8_,local_250._16_8_ + 1);
    }
LAB_003167c2:
    pcVar6 = (cmCTestBuildHandler *)0x0;
  }
  else {
    this->Handler = pcVar6;
    pcVar2 = (this->super_cmCTestHandlerCommand).super_cmCTestCommand.super_cmCommand.Makefile;
    std::__cxx11::string::_M_construct<char_const*>((string *)local_250,"CTEST_BUILD_COMMAND","");
    pcVar7 = cmMakefile::GetDefinition(pcVar2,(string *)local_250);
    if ((undefined1 *)local_250._0_8_ != local_250 + 0x10) {
      operator_delete((void *)local_250._0_8_,local_250._16_8_ + 1);
    }
    if ((pcVar7 == (char *)0x0) || (*pcVar7 == '\0')) {
      pcVar2 = (this->super_cmCTestHandlerCommand).super_cmCTestCommand.super_cmCommand.Makefile;
      local_250._0_8_ = local_250 + 0x10;
      std::__cxx11::string::_M_construct<char_const*>
                ((string *)local_250,"CTEST_CMAKE_GENERATOR","");
      pcVar7 = cmMakefile::GetDefinition(pcVar2,(string *)local_250);
      if ((undefined1 *)local_250._0_8_ != local_250 + 0x10) {
        operator_delete((void *)local_250._0_8_,local_250._16_8_ + 1);
      }
      pcVar8 = (this->super_cmCTestHandlerCommand).Values.
               super__Vector_base<const_char_*,_std::allocator<const_char_*>_>._M_impl.
               super__Vector_impl_data._M_start[0xc];
      if ((pcVar8 == (char *)0x0) || (*pcVar8 == '\0')) {
        pcVar2 = (this->super_cmCTestHandlerCommand).super_cmCTestCommand.super_cmCommand.Makefile;
        local_50._M_dataplus._M_p = (pointer)&local_50.field_2;
        std::__cxx11::string::_M_construct<char_const*>((string *)&local_50,"CTEST_PROJECT_NAME","")
        ;
        pcVar8 = cmMakefile::GetDefinition(pcVar2,&local_50);
        bVar4 = true;
      }
      else {
        bVar4 = false;
      }
      if ((bVar4) &&
         ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_50._M_dataplus._M_p != &local_50.field_2)) {
        operator_delete(local_50._M_dataplus._M_p,local_50.field_2._M_allocated_capacity + 1);
      }
      pcVar2 = (this->super_cmCTestHandlerCommand).super_cmCTestCommand.super_cmCommand.Makefile;
      local_250._0_8_ = local_250 + 0x10;
      std::__cxx11::string::_M_construct<char_const*>
                ((string *)local_250,"CTEST_BUILD_CONFIGURATION","");
      pcVar9 = cmMakefile::GetDefinition(pcVar2,(string *)local_250);
      if ((undefined1 *)local_250._0_8_ != local_250 + 0x10) {
        operator_delete((void *)local_250._0_8_,local_250._16_8_ + 1);
      }
      pcVar14 = (this->super_cmCTestHandlerCommand).Values.
                super__Vector_base<const_char_*,_std::allocator<const_char_*>_>._M_impl.
                super__Vector_impl_data._M_start[10];
      if (((pcVar14 == (char *)0x0) || (*pcVar14 == '\0')) &&
         ((pcVar9 == (char *)0x0 || (pcVar14 = pcVar9, *pcVar9 == '\0')))) {
        psVar10 = cmCTest::GetConfigType_abi_cxx11_
                            ((this->super_cmCTestHandlerCommand).super_cmCTestCommand.CTest);
        pcVar14 = (psVar10->_M_dataplus)._M_p;
      }
      local_278 = (this->super_cmCTestHandlerCommand).Values.
                  super__Vector_base<const_char_*,_std::allocator<const_char_*>_>._M_impl.
                  super__Vector_impl_data._M_start[0xb];
      if ((local_278 == (char *)0x0) || (*local_278 == '\0')) {
        pcVar2 = (this->super_cmCTestHandlerCommand).super_cmCTestCommand.super_cmCommand.Makefile;
        local_70._M_dataplus._M_p = (pointer)&local_70.field_2;
        std::__cxx11::string::_M_construct<char_const*>((string *)&local_70,"CTEST_BUILD_FLAGS","");
        local_278 = cmMakefile::GetDefinition(pcVar2,&local_70);
        bVar4 = true;
      }
      else {
        bVar4 = false;
      }
      if ((bVar4) &&
         ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_70._M_dataplus._M_p != &local_70.field_2)) {
        operator_delete(local_70._M_dataplus._M_p,local_70.field_2._M_allocated_capacity + 1);
      }
      pcVar9 = (this->super_cmCTestHandlerCommand).Values.
               super__Vector_base<const_char_*,_std::allocator<const_char_*>_>._M_impl.
               super__Vector_impl_data._M_start[9];
      if ((pcVar9 == (char *)0x0) || (*pcVar9 == '\0')) {
        pcVar2 = (this->super_cmCTestHandlerCommand).super_cmCTestCommand.super_cmCommand.Makefile;
        local_90._M_dataplus._M_p = (pointer)&local_90.field_2;
        std::__cxx11::string::_M_construct<char_const*>((string *)&local_90,"CTEST_BUILD_TARGET","")
        ;
        pcVar9 = cmMakefile::GetDefinition(pcVar2,&local_90);
        bVar4 = true;
      }
      else {
        bVar4 = false;
      }
      if ((bVar4) &&
         ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_90._M_dataplus._M_p != &local_90.field_2)) {
        operator_delete(local_90._M_dataplus._M_p,local_90.field_2._M_allocated_capacity + 1);
      }
      if ((((pcVar7 == (char *)0x0) || (pcVar8 == (char *)0x0)) || (*pcVar7 == '\0')) ||
         (*pcVar8 == '\0')) {
        std::__cxx11::ostringstream::ostringstream((ostringstream *)local_250);
        std::__ostream_insert<char,std::char_traits<char>>
                  ((ostream *)local_250,
                   "has no project to build. If this is a \"built with CMake\" project, verify that CTEST_CMAKE_GENERATOR and CTEST_PROJECT_NAME are set.\nCTEST_PROJECT_NAME is usually set in CTestConfig.cmake. Verify that CTestConfig.cmake exists, or CTEST_PROJECT_NAME is set in the script, or PROJECT_NAME is passed as an argument to ctest_build.\nAlternatively, set CTEST_BUILD_COMMAND to build the project with a custom command line."
                   ,0x19e);
        std::__cxx11::stringbuf::str();
        cmCommand::SetError((cmCommand *)this,&local_270);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_270._M_dataplus._M_p != &local_270.field_2) {
          operator_delete(local_270._M_dataplus._M_p,local_270.field_2._M_allocated_capacity + 1);
        }
        std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_250);
        std::ios_base::~ios_base(local_1e0);
        goto LAB_003167c2;
      }
      pcVar8 = "Release";
      if (pcVar14 != (char *)0x0) {
        pcVar8 = pcVar14;
      }
      if (this->GlobalGenerator != (cmGlobalGenerator *)0x0) {
        (*this->GlobalGenerator->_vptr_cmGlobalGenerator[3])(local_250);
        iVar5 = std::__cxx11::string::compare(local_250);
        if ((undefined1 *)local_250._0_8_ != local_250 + 0x10) {
          operator_delete((void *)local_250._0_8_,local_250._16_8_ + 1);
        }
        if (iVar5 != 0) {
          if (this->GlobalGenerator != (cmGlobalGenerator *)0x0) {
            (*this->GlobalGenerator->_vptr_cmGlobalGenerator[1])();
          }
          this->GlobalGenerator = (cmGlobalGenerator *)0x0;
        }
      }
      if (this->GlobalGenerator == (cmGlobalGenerator *)0x0) {
        local_d8 = pcVar8;
        this_00 = cmMakefile::GetCMakeInstance
                            ((this->super_cmCTestHandlerCommand).super_cmCTestCommand.
                             super_cmCommand.Makefile);
        local_250._0_8_ = local_250 + 0x10;
        sVar11 = strlen(pcVar7);
        std::__cxx11::string::_M_construct<char_const*>((string *)local_250,pcVar7,pcVar7 + sVar11);
        pcVar12 = cmake::CreateGlobalGenerator(this_00,(string *)local_250);
        pcVar8 = local_d8;
        this->GlobalGenerator = pcVar12;
        if ((undefined1 *)local_250._0_8_ != local_250 + 0x10) {
          operator_delete((void *)local_250._0_8_,local_250._16_8_ + 1);
        }
        if (this->GlobalGenerator == (cmGlobalGenerator *)0x0) {
          local_250._0_8_ = local_250 + 0x10;
          std::__cxx11::string::_M_construct<char_const*>
                    ((string *)local_250,"could not create generator named \"","");
          std::__cxx11::string::append(local_250);
          std::__cxx11::string::append(local_250);
          cmMakefile::IssueMessage
                    ((this->super_cmCTestHandlerCommand).super_cmCTestCommand.super_cmCommand.
                     Makefile,FATAL_ERROR,(string *)local_250);
          cmSystemTools::s_FatalErrorOccured = true;
          if ((undefined1 *)local_250._0_8_ != local_250 + 0x10) goto LAB_00316185;
          goto LAB_003167c2;
        }
      }
      pcVar7 = "Debug";
      if (*pcVar8 != '\0') {
        pcVar7 = pcVar8;
      }
      pcVar3 = (this->super_cmCTestHandlerCommand).super_cmCTestCommand.CTest;
      local_250._0_8_ = local_250 + 0x10;
      std::__cxx11::string::_M_construct<char_const*>((string *)local_250,"BuildDirectory","");
      cmCTest::GetCTestConfiguration(&local_270,pcVar3,(string *)local_250);
      if ((undefined1 *)local_250._0_8_ != local_250 + 0x10) {
        operator_delete((void *)local_250._0_8_,local_250._16_8_ + 1);
      }
      pcVar12 = this->GlobalGenerator;
      if (pcVar9 == (char *)0x0) {
        pcVar9 = "";
      }
      local_250._0_8_ = local_250 + 0x10;
      sVar11 = strlen(pcVar9);
      std::__cxx11::string::_M_construct<char_const*>((string *)local_250,pcVar9,pcVar9 + sVar11);
      local_298._M_dataplus._M_p = (pointer)&local_298.field_2;
      sVar11 = strlen(pcVar7);
      std::__cxx11::string::_M_construct<char_const*>((string *)&local_298,pcVar7,pcVar7 + sVar11);
      pcVar7 = "";
      if (local_278 != (char *)0x0) {
        pcVar7 = local_278;
      }
      local_b0._M_dataplus._M_p = (pointer)&local_b0.field_2;
      sVar11 = strlen(pcVar7);
      std::__cxx11::string::_M_construct<char_const*>((string *)&local_b0,pcVar7,pcVar7 + sVar11);
      bVar4 = cmMakefile::IgnoreErrorsCMP0061
                        ((this->super_cmCTestHandlerCommand).super_cmCTestCommand.super_cmCommand.
                         Makefile);
      cmGlobalGenerator::GenerateCMakeBuildCommand
                (&local_d0,pcVar12,(string *)local_250,&local_298,&local_b0,bVar4);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_b0._M_dataplus._M_p != &local_b0.field_2) {
        operator_delete(local_b0._M_dataplus._M_p,local_b0.field_2._M_allocated_capacity + 1);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_298._M_dataplus._M_p != &local_298.field_2) {
        operator_delete(local_298._M_dataplus._M_p,local_298.field_2._M_allocated_capacity + 1);
      }
      if ((undefined1 *)local_250._0_8_ != local_250 + 0x10) {
        operator_delete((void *)local_250._0_8_,local_250._16_8_ + 1);
      }
      std::__cxx11::ostringstream::ostringstream((ostringstream *)local_250);
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_250,"SetMakeCommand:",0xf)
      ;
      poVar13 = std::__ostream_insert<char,std::char_traits<char>>
                          ((ostream *)local_250,local_d0._M_dataplus._M_p,local_d0._M_string_length)
      ;
      std::__ostream_insert<char,std::char_traits<char>>(poVar13,"\n",1);
      pcVar3 = (this->super_cmCTestHandlerCommand).super_cmCTestCommand.CTest;
      std::__cxx11::stringbuf::str();
      cmCTest::Log(pcVar3,4,
                   "/workspace/llm4binary/github/license_c_cmakelists/jdavidberger[P]CMake/Source/CTest/cmCTestBuildCommand.cxx"
                   ,0x7f,local_298._M_dataplus._M_p,(this->super_cmCTestHandlerCommand).Quiet);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_298._M_dataplus._M_p != &local_298.field_2) {
        operator_delete(local_298._M_dataplus._M_p,local_298.field_2._M_allocated_capacity + 1);
      }
      std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_250);
      std::ios_base::~ios_base(local_1e0);
      cmCTest::SetCTestConfiguration
                ((this->super_cmCTestHandlerCommand).super_cmCTestCommand.CTest,"MakeCommand",
                 local_d0._M_dataplus._M_p,(this->super_cmCTestHandlerCommand).Quiet);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_d0._M_dataplus._M_p != &local_d0.field_2) {
        operator_delete(local_d0._M_dataplus._M_p,local_d0.field_2._M_allocated_capacity + 1);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_270._M_dataplus._M_p != &local_270.field_2) {
        operator_delete(local_270._M_dataplus._M_p,local_270.field_2._M_allocated_capacity + 1);
      }
    }
    else {
      cmCTest::SetCTestConfiguration
                ((this->super_cmCTestHandlerCommand).super_cmCTestCommand.CTest,"MakeCommand",pcVar7
                 ,(this->super_cmCTestHandlerCommand).Quiet);
    }
    pcVar2 = (this->super_cmCTestHandlerCommand).super_cmCTestCommand.super_cmCommand.Makefile;
    local_250._0_8_ = local_250 + 0x10;
    std::__cxx11::string::_M_construct<char_const*>((string *)local_250,"CTEST_USE_LAUNCHERS","");
    pcVar7 = cmMakefile::GetDefinition(pcVar2,(string *)local_250);
    if ((undefined1 *)local_250._0_8_ != local_250 + 0x10) {
      operator_delete((void *)local_250._0_8_,local_250._16_8_ + 1);
    }
    if (pcVar7 != (char *)0x0) {
      cmCTest::SetCTestConfiguration
                ((this->super_cmCTestHandlerCommand).super_cmCTestCommand.CTest,"UseLaunchers",
                 pcVar7,(this->super_cmCTestHandlerCommand).Quiet);
    }
    pcVar2 = (this->super_cmCTestHandlerCommand).super_cmCTestCommand.super_cmCommand.Makefile;
    local_250._0_8_ = local_250 + 0x10;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)local_250,"CTEST_LABELS_FOR_SUBPROJECTS","");
    pcVar7 = cmMakefile::GetDefinition(pcVar2,(string *)local_250);
    if ((undefined1 *)local_250._0_8_ != local_250 + 0x10) {
      operator_delete((void *)local_250._0_8_,local_250._16_8_ + 1);
    }
    if (pcVar7 != (char *)0x0) {
      cmCTest::SetCTestConfiguration
                ((this->super_cmCTestHandlerCommand).super_cmCTestCommand.CTest,
                 "LabelsForSubprojects",pcVar7,(this->super_cmCTestHandlerCommand).Quiet);
    }
    (pcVar6->super_cmCTestGenericHandler).Quiet = (this->super_cmCTestHandlerCommand).Quiet;
  }
  return &pcVar6->super_cmCTestGenericHandler;
}

Assistant:

cmCTestGenericHandler* cmCTestBuildCommand::InitializeHandler()
{
  cmCTestGenericHandler* handler = this->CTest->GetInitializedHandler("build");
  if (!handler) {
    this->SetError("internal CTest error. Cannot instantiate build handler");
    return CM_NULLPTR;
  }
  this->Handler = (cmCTestBuildHandler*)handler;

  const char* ctestBuildCommand =
    this->Makefile->GetDefinition("CTEST_BUILD_COMMAND");
  if (ctestBuildCommand && *ctestBuildCommand) {
    this->CTest->SetCTestConfiguration("MakeCommand", ctestBuildCommand,
                                       this->Quiet);
  } else {
    const char* cmakeGeneratorName =
      this->Makefile->GetDefinition("CTEST_CMAKE_GENERATOR");
    const char* cmakeProjectName =
      (this->Values[ctb_PROJECT_NAME] && *this->Values[ctb_PROJECT_NAME])
      ? this->Values[ctb_PROJECT_NAME]
      : this->Makefile->GetDefinition("CTEST_PROJECT_NAME");

    // Build configuration is determined by: CONFIGURATION argument,
    // or CTEST_BUILD_CONFIGURATION script variable, or
    // CTEST_CONFIGURATION_TYPE script variable, or ctest -C command
    // line argument... in that order.
    //
    const char* ctestBuildConfiguration =
      this->Makefile->GetDefinition("CTEST_BUILD_CONFIGURATION");
    const char* cmakeBuildConfiguration =
      (this->Values[ctb_CONFIGURATION] && *this->Values[ctb_CONFIGURATION])
      ? this->Values[ctb_CONFIGURATION]
      : ((ctestBuildConfiguration && *ctestBuildConfiguration)
           ? ctestBuildConfiguration
           : this->CTest->GetConfigType().c_str());

    const char* cmakeBuildAdditionalFlags =
      (this->Values[ctb_FLAGS] && *this->Values[ctb_FLAGS])
      ? this->Values[ctb_FLAGS]
      : this->Makefile->GetDefinition("CTEST_BUILD_FLAGS");
    const char* cmakeBuildTarget =
      (this->Values[ctb_TARGET] && *this->Values[ctb_TARGET])
      ? this->Values[ctb_TARGET]
      : this->Makefile->GetDefinition("CTEST_BUILD_TARGET");

    if (cmakeGeneratorName && *cmakeGeneratorName && cmakeProjectName &&
        *cmakeProjectName) {
      if (!cmakeBuildConfiguration) {
        cmakeBuildConfiguration = "Release";
      }
      if (this->GlobalGenerator) {
        if (this->GlobalGenerator->GetName() != cmakeGeneratorName) {
          delete this->GlobalGenerator;
          this->GlobalGenerator = CM_NULLPTR;
        }
      }
      if (!this->GlobalGenerator) {
        this->GlobalGenerator =
          this->Makefile->GetCMakeInstance()->CreateGlobalGenerator(
            cmakeGeneratorName);
        if (!this->GlobalGenerator) {
          std::string e = "could not create generator named \"";
          e += cmakeGeneratorName;
          e += "\"";
          this->Makefile->IssueMessage(cmake::FATAL_ERROR, e);
          cmSystemTools::SetFatalErrorOccured();
          return CM_NULLPTR;
        }
      }
      if (strlen(cmakeBuildConfiguration) == 0) {
        const char* config = CM_NULLPTR;
#ifdef CMAKE_INTDIR
        config = CMAKE_INTDIR;
#endif
        if (!config) {
          config = "Debug";
        }
        cmakeBuildConfiguration = config;
      }

      std::string dir = this->CTest->GetCTestConfiguration("BuildDirectory");
      std::string buildCommand =
        this->GlobalGenerator->GenerateCMakeBuildCommand(
          cmakeBuildTarget ? cmakeBuildTarget : "", cmakeBuildConfiguration,
          cmakeBuildAdditionalFlags ? cmakeBuildAdditionalFlags : "",
          this->Makefile->IgnoreErrorsCMP0061());
      cmCTestOptionalLog(this->CTest, HANDLER_VERBOSE_OUTPUT,
                         "SetMakeCommand:" << buildCommand << "\n",
                         this->Quiet);
      this->CTest->SetCTestConfiguration("MakeCommand", buildCommand.c_str(),
                                         this->Quiet);
    } else {
      std::ostringstream ostr;
      /* clang-format off */
      ostr << "has no project to build. If this is a "
        "\"built with CMake\" project, verify that CTEST_CMAKE_GENERATOR "
        "and CTEST_PROJECT_NAME are set."
        "\n"
        "CTEST_PROJECT_NAME is usually set in CTestConfig.cmake. Verify "
        "that CTestConfig.cmake exists, or CTEST_PROJECT_NAME "
        "is set in the script, or PROJECT_NAME is passed as an argument "
        "to ctest_build."
        "\n"
        "Alternatively, set CTEST_BUILD_COMMAND to build the project "
        "with a custom command line.";
      /* clang-format on */
      this->SetError(ostr.str());
      return CM_NULLPTR;
    }
  }

  if (const char* useLaunchers =
        this->Makefile->GetDefinition("CTEST_USE_LAUNCHERS")) {
    this->CTest->SetCTestConfiguration("UseLaunchers", useLaunchers,
                                       this->Quiet);
  }

  if (const char* labelsForSubprojects =
        this->Makefile->GetDefinition("CTEST_LABELS_FOR_SUBPROJECTS")) {
    this->CTest->SetCTestConfiguration("LabelsForSubprojects",
                                       labelsForSubprojects, this->Quiet);
  }

  handler->SetQuiet(this->Quiet);
  return handler;
}